

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolution.cpp
# Opt level: O0

bool getComplementarityViolations
               (HighsLp *lp,HighsSolution *solution,double *max_complementarity_violation,
               double *sum_complementarity_violations)

{
  const_reference pvVar1;
  double *pdVar2;
  double *in_RCX;
  double *in_RDX;
  long in_RSI;
  int *in_RDI;
  double complementarity_violation;
  double dual_residual;
  double mid;
  double upper;
  double lower;
  double dual;
  double primal;
  HighsInt iRow;
  bool is_col;
  HighsInt iVar;
  double primal_residual;
  double local_a0;
  double local_98;
  value_type local_90;
  value_type local_88;
  value_type local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  value_type local_58;
  value_type local_50;
  value_type local_48;
  int local_3c;
  byte local_35;
  int local_34;
  double local_30;
  double *local_28;
  double *local_20;
  long local_18;
  int *local_10;
  bool local_1;
  
  *in_RDX = INFINITY;
  *in_RCX = INFINITY;
  if ((*(byte *)(in_RSI + 1) & 1) == 0) {
    local_1 = false;
  }
  else {
    *in_RDX = 0.0;
    *in_RCX = 0.0;
    local_30 = 0.0;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    for (local_34 = 0; local_34 < *local_10 + local_10[1]; local_34 = local_34 + 1) {
      local_35 = local_34 < *local_10;
      local_3c = local_34 - *local_10;
      if ((bool)local_35) {
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 8),(long)local_34
                           );
        local_80 = *pvVar1;
      }
      else {
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 0x38),
                            (long)local_3c);
        local_80 = *pvVar1;
      }
      local_48 = local_80;
      if ((local_35 & 1) == 0) {
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 0x50),
                            (long)local_3c);
        local_88 = *pvVar1;
      }
      else {
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_18 + 0x20),
                            (long)local_34);
        local_88 = *pvVar1;
      }
      local_50 = local_88;
      if ((local_35 & 1) == 0) {
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_10 + 0x14),
                            (long)local_3c);
        local_90 = *pvVar1;
      }
      else {
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_10 + 8),(long)local_34
                           );
        local_90 = *pvVar1;
      }
      local_58 = local_90;
      if ((local_35 & 1) == 0) {
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_10 + 0x1a),
                            (long)local_3c);
        local_98 = *pvVar1;
      }
      else {
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           ((vector<double,_std::allocator<double>_> *)(local_10 + 0xe),
                            (long)local_34);
        local_98 = *pvVar1;
      }
      local_60 = local_98;
      if ((-INFINITY < local_58) || (local_98 < INFINITY)) {
        local_68 = (local_58 + local_98) * 0.5;
        if (local_48 < local_68) {
          local_98 = local_58;
        }
        local_a0 = ABS(local_98 - local_48);
        local_30 = local_a0;
      }
      else {
        local_30 = 1.0;
      }
      local_70 = ABS(local_50);
      local_78 = local_30 * local_70;
      *local_28 = local_78 + *local_28;
      pdVar2 = std::max<double>(&local_78,local_20);
      *local_20 = *pdVar2;
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool getComplementarityViolations(const HighsLp& lp,
                                  const HighsSolution& solution,
                                  double& max_complementarity_violation,
                                  double& sum_complementarity_violations) {
  max_complementarity_violation = kHighsIllegalComplementarityViolation;
  sum_complementarity_violations = kHighsIllegalComplementarityViolation;
  if (!solution.dual_valid) return false;

  max_complementarity_violation = 0;
  sum_complementarity_violations = 0;
  double primal_residual = 0;
  for (HighsInt iVar = 0; iVar < lp.num_col_ + lp.num_row_; iVar++) {
    const bool is_col = iVar < lp.num_col_;
    const HighsInt iRow = iVar - lp.num_col_;
    const double primal =
        is_col ? solution.col_value[iVar] : solution.row_value[iRow];
    const double dual =
        is_col ? solution.col_dual[iVar] : solution.row_dual[iRow];
    const double lower = is_col ? lp.col_lower_[iVar] : lp.row_lower_[iRow];
    const double upper = is_col ? lp.col_upper_[iVar] : lp.row_upper_[iRow];
    if (lower <= -kHighsInf && upper >= kHighsInf) {
      // Free
      primal_residual = 1;
    } else {
      const double mid = (lower + upper) * 0.5;
      primal_residual =
          primal < mid ? std::fabs(lower - primal) : std::fabs(upper - primal);
    }
    const double dual_residual = std::fabs(dual);
    const double complementarity_violation = primal_residual * dual_residual;
    sum_complementarity_violations += complementarity_violation;
    max_complementarity_violation =
        std::max(complementarity_violation, max_complementarity_violation);
  }
  return true;
}